

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O3

string * __thiscall positionTy::dbgTxt_abi_cxx11_(string *__return_storage_ptr__,positionTy *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  posFlagsTy pVar5;
  ulong uVar6;
  byte bVar7;
  size_t sVar8;
  char *pcVar9;
  char cVar10;
  ulong uVar11;
  undefined8 uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *local_148;
  string local_118;
  char buf [200];
  
  dVar1 = this->_ts;
  dVar2 = this->_lat;
  dVar3 = this->_alt;
  dVar4 = this->_lon;
  pVar5 = this->f;
  bVar7 = pVar5._1_1_ & 3;
  pcVar9 = "GND_UNKNOWN";
  if (bVar7 == 2) {
    pcVar9 = "GND_ON";
  }
  pcVar15 = "GND_OFF";
  if (bVar7 != 1) {
    pcVar15 = pcVar9;
  }
  bVar7 = pVar5._1_1_ >> 4 & 3;
  pcVar9 = "   ";
  if (bVar7 == 3) {
    pcVar9 = "RWY";
  }
  pcVar14 = "TXI";
  if (bVar7 != 2) {
    pcVar14 = pcVar9;
  }
  pcVar13 = "SUP";
  if (bVar7 != 1) {
    pcVar13 = pcVar14;
  }
  pcVar14 = "CT";
  if (((ushort)pVar5 >> 0xe & 1) == 0) {
    pcVar14 = "  ";
  }
  cVar10 = pVar5._0_1_;
  if (((ushort)pVar5 & 0x7f) == 0) {
    local_148 = "";
  }
  else {
    LTAircraft::FlightPhase2String_abi_cxx11_
              (&local_118,(LTAircraft *)(ulong)((ushort)pVar5 & 0x7f),(flightPhaseE)pcVar9);
    local_148 = local_118._M_dataplus._M_p;
    cVar10 = SUB21(this->f,0);
  }
  uVar6 = this->edgeIdx;
  uVar11 = 0;
  if (uVar6 < 0xfffffffffffffffe) {
    uVar11 = uVar6;
  }
  uVar12 = 0x2a;
  if (-1 < cVar10) {
    uVar12 = 0x20;
  }
  snprintf(buf,200,
           "%.1f: (%7.5f, %7.5f) %7.1fft %8.8s %3.3s %2.2s %-13.13s %4.*zu {h %3.0f%c, p %3.0f, r %3.0f}"
           ,dVar1,dVar2,dVar4,dVar3 / 0.3048,this->_head,this->_pitch,this->_roll,pcVar15,pcVar13,
           pcVar14,local_148,(ulong)(uVar6 < 0xfffffffffffffffe),uVar11,uVar12);
  if ((((ushort)pVar5 & 0x7f) != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2)) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar8 = strlen(buf);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,buf,buf + sVar8);
  return __return_storage_ptr__;
}

Assistant:

std::string positionTy::dbgTxt () const
{
    char buf[200];
    snprintf(buf, sizeof(buf), "%.1f: (%7.5f, %7.5f) %7.1fft %8.8s %3.3s %2.2s %-13.13s %4.*zu {h %3.0f%c, p %3.0f, r %3.0f}",
             ts(),
             lat(), lon(),
             alt_ft(),
             GrndE2String(f.onGrnd),
             SpecialPosE2String(f.specialPos),
             f.bCutCorner ? "CT" : "  ",
             f.flightPhase ? (LTAircraft::FlightPhase2String(f.flightPhase)).c_str() : "",
             HasTaxiEdge() ? 1 : 0,
             HasTaxiEdge() ? edgeIdx : 0,
             heading(),
             (f.bHeadFixed ? '*' : ' '),
             pitch(), roll());
    return std::string(buf);
}